

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHPadding_Test::TestBody(SSLTest_ECHPadding_Test *this)

{
  AssertHelper *this_00;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  bool bVar2;
  SSL_METHOD *meth;
  pointer *__ptr;
  ScopedTrace *this_01;
  char *in_R8;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_4;
  long lVar4;
  ScopedTrace gtest_trace_2251;
  ScopedTrace gtest_trace_2224;
  size_t client_hello_len_baseline2;
  size_t ech_len_baseline2;
  size_t client_hello_len;
  size_t ech_len;
  size_t ech_len_baseline;
  size_t client_hello_len_baseline;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  ScopedTrace local_81;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  AssertHelper local_50;
  undefined1 local_48 [16];
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_38;
  
  meth = (SSL_METHOD *)TLS_method();
  local_38._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_b8._M_head_impl._0_1_ = (internal)(local_38._M_head_impl != (SSL_CTX *)0x0);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_b8,(AssertionResult *)0x336329,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8a7,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = GetECHLength(local_38._M_head_impl,(size_t *)local_48,(size_t *)&local_50,0x3377a9,in_R8
                        );
    local_b8._M_head_impl._0_1_ = (internal)bVar2;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      lVar4 = 0;
      do {
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (long)*(int *)((long)&DAT_0032a140 + lVar4);
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  ((ScopedTrace *)&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b0,(unsigned_long *)&local_60);
        _Var1._M_head_impl = local_38._M_head_impl;
        local_a8 = (undefined1  [8])&local_98;
        std::__cxx11::string::_M_construct((ulong)local_a8,(char)local_60._M_head_impl);
        bVar2 = GetECHLength(_Var1._M_head_impl,(size_t *)&local_58,(size_t *)&local_70,
                             (size_t)local_a8,in_R8);
        local_b8._M_head_impl._0_1_ = (internal)bVar2;
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          bVar2 = (bool)((byte)local_b8._M_head_impl._0_1_ & 1);
        }
        if (bVar2 == false) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)&local_b8,
                     (AssertionResult *)
                     "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b3,(char *)local_a8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_68)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_68.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b0,local_b0);
          }
          this_01 = (ScopedTrace *)&local_78;
          goto LAB_0016837f;
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"client_hello_len","client_hello_len_baseline",
                   (unsigned_long *)&local_58,(unsigned_long *)local_48);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          pcVar3 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b4,pcVar3);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        in_R8 = (char *)&local_50;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"ech_len","ech_len_baseline",(unsigned_long *)&local_70,
                   (unsigned_long *)in_R8);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          in_R8 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            in_R8 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b5,in_R8);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_78);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x18);
      bVar2 = GetECHLength(local_38._M_head_impl,(size_t *)&local_60,(size_t *)&local_58,0,in_R8);
      local_b8._M_head_impl._0_1_ = (internal)bVar2;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"client_hello_len","client_hello_len_baseline",
                   (unsigned_long *)&local_60,(unsigned_long *)local_48);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bc,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        pcVar3 = (char *)&local_50;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"ech_len","ech_len_baseline",(unsigned_long *)&local_58,
                   (unsigned_long *)pcVar3);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bd,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        _Var1._M_head_impl = local_38._M_head_impl;
        local_a8 = (undefined1  [8])&local_98;
        std::__cxx11::string::_M_construct((ulong)local_a8,-0x60);
        bVar2 = GetECHLength(_Var1._M_head_impl,(size_t *)&local_70,(size_t *)&local_68,
                             (size_t)local_a8,pcVar3);
        local_b8._M_head_impl._0_1_ = (internal)bVar2;
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_a8 == (undefined1  [8])&local_98) {
          if (!bVar2) goto LAB_00168603;
        }
        else {
          operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          if (((ulong)local_b8._M_head_impl & 1) == 0) {
LAB_00168603:
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a8,(internal *)&local_b8,
                       (AssertionResult *)
                       "GetECHLength(ctx.get(), &client_hello_len_baseline2, &ech_len_baseline2, 128, std::string(128 + 32, \'a\').c_str())"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8c4,(char *)local_a8);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            local_48._0_8_ = local_80._M_head_impl;
            if (local_a8 != (undefined1  [8])&local_98) {
              operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
              local_48._0_8_ = local_80._M_head_impl;
            }
            goto LAB_001682af;
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        local_b8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((local_50.data_)->message)._M_string_length;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"ech_len_baseline2","ech_len_baseline + 32",
                   (unsigned_long *)&local_68,(unsigned_long *)&local_b8);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8c5,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        pcVar3 = local_48;
        testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                  ((internal *)local_a8,"client_hello_len_baseline2","client_hello_len_baseline",
                   (unsigned_long *)&local_70,(unsigned_long *)pcVar3);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8c8,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        local_80._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x81;
        this_00 = (AssertHelper *)(local_48 + 8);
        do {
          testing::ScopedTrace::ScopedTrace<unsigned_long>
                    (&local_81,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8cb,(unsigned_long *)&local_80);
          _Var1._M_head_impl = local_38._M_head_impl;
          local_a8 = (undefined1  [8])&local_98;
          std::__cxx11::string::_M_construct((ulong)local_a8,(char)local_80._M_head_impl);
          bVar2 = GetECHLength(_Var1._M_head_impl,(size_t *)&local_60,(size_t *)&local_58,
                               (size_t)local_a8,pcVar3);
          local_b8._M_head_impl._0_1_ = (internal)bVar2;
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_a8 == (undefined1  [8])&local_98) {
            if (!bVar2) goto LAB_00168a14;
          }
          else {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
            if (((ulong)local_b8._M_head_impl & 1) == 0) {
LAB_00168a14:
              testing::Message::Message((Message *)&local_78);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_a8,(internal *)&local_b8,
                         (AssertionResult *)
                         "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)(local_48 + 8),kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x8cd,(char *)local_a8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)(local_48 + 8),(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_48 + 8));
              if (local_a8 != (undefined1  [8])&local_98) {
                operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
              }
              if (local_78.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
              if (local_b0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_b0,local_b0);
              }
              this_01 = &local_81;
LAB_0016837f:
              testing::ScopedTrace::~ScopedTrace(this_01);
              break;
            }
          }
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b0,local_b0);
          }
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_58.data_ != local_68.data_ && local_58.data_ != local_50.data_) {
            local_b8._M_head_impl._0_1_ =
                 (internal)(local_58.data_ == local_68.data_ || local_58.data_ == local_50.data_);
            testing::Message::Message((Message *)&local_78);
            std::ostream::_M_insert<unsigned_long>((ulong)&(local_78.data_)->line);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a8,(internal *)&local_b8,
                       (AssertionResult *)
                       "ech_len == ech_len_baseline || ech_len == ech_len_baseline2","false","true",
                       in_R9);
            pcVar3 = (char *)local_a8;
            testing::internal::AssertHelper::AssertHelper
                      (this_00,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8ce,(char *)local_a8);
            testing::internal::AssertHelper::operator=(this_00,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            if (local_a8 != (undefined1  [8])&local_98) {
              operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
          }
          local_b8._M_head_impl._0_1_ =
               (internal)
               (local_60._M_head_impl == local_70._M_head_impl ||
               local_60._M_head_impl ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_48._0_8_);
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_60._M_head_impl != local_70._M_head_impl &&
              local_60._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_48._0_8_) {
            testing::Message::Message((Message *)&local_78);
            std::ostream::_M_insert<unsigned_long>((ulong)&(local_78.data_)->line);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a8,(internal *)&local_b8,
                       (AssertionResult *)
                       "client_hello_len == client_hello_len_baseline || client_hello_len == client_hello_len_baseline2"
                       ,"false","true",in_R9);
            pcVar3 = (char *)local_a8;
            testing::internal::AssertHelper::AssertHelper
                      (this_00,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8d1,(char *)local_a8);
            testing::internal::AssertHelper::operator=(this_00,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            if (local_a8 != (undefined1  [8])&local_98) {
              operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
          }
          testing::ScopedTrace::~ScopedTrace(&local_81);
          local_80._M_head_impl = local_80._M_head_impl + 1;
        } while (local_80._M_head_impl <
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa0);
        goto LAB_00168384;
      }
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_b8,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8bb,(char *)local_a8);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      local_48._0_8_ = local_70._M_head_impl;
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        local_48._0_8_ = local_70._M_head_impl;
      }
    }
    else {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_b8,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len_baseline, &ech_len_baseline, 128, \"example.com\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8ac,(char *)local_a8);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      local_48._0_8_ = local_60._M_head_impl;
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        local_48._0_8_ = local_60._M_head_impl;
      }
    }
  }
LAB_001682af:
  if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_48._0_8_ !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
LAB_00168384:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST(SSLTest, ECHPadding) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Sample lengths with max_name_len = 128 as baseline.
  size_t client_hello_len_baseline, ech_len_baseline;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline,
                           &ech_len_baseline, 128, "example.com"));

  // Check that all name lengths under the server's maximum look the same.
  for (size_t name_len : {1, 2, 32, 64, 127, 128}) {
    SCOPED_TRACE(name_len);
    size_t client_hello_len, ech_len;
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_EQ(client_hello_len, client_hello_len_baseline);
    EXPECT_EQ(ech_len, ech_len_baseline);
  }

  // When sending no SNI, we must still pad as if we are sending one.
  size_t client_hello_len, ech_len;
  ASSERT_TRUE(
      GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr));
  EXPECT_EQ(client_hello_len, client_hello_len_baseline);
  EXPECT_EQ(ech_len, ech_len_baseline);

  // Name lengths above the maximum do not get named-based padding, but the
  // overall input is padded to a multiple of 32.
  size_t client_hello_len_baseline2, ech_len_baseline2;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline2,
                           &ech_len_baseline2, 128,
                           std::string(128 + 32, 'a').c_str()));
  EXPECT_EQ(ech_len_baseline2, ech_len_baseline + 32);
  // The ClientHello lengths may match if we are still under the threshold for
  // padding extension.
  EXPECT_GE(client_hello_len_baseline2, client_hello_len_baseline);

  for (size_t name_len = 128 + 1; name_len < 128 + 32; name_len++) {
    SCOPED_TRACE(name_len);
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_TRUE(ech_len == ech_len_baseline || ech_len == ech_len_baseline2)
        << ech_len;
    EXPECT_TRUE(client_hello_len == client_hello_len_baseline ||
                client_hello_len == client_hello_len_baseline2)
        << client_hello_len;
  }
}